

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O0

vector<UniValue,_std::allocator<UniValue>_> * JSONRPCProcessBatchReply(UniValue *in)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  runtime_error *prVar4;
  size_t sVar5;
  UniValue *this;
  reference this_00;
  ulong uVar6;
  vector<UniValue,_std::allocator<UniValue>_> *in_RDI;
  long in_FS_OFFSET;
  size_t id;
  UniValue *rec;
  vector<UniValue,_std::allocator<UniValue>_> *__range1;
  size_t num;
  vector<UniValue,_std::allocator<UniValue>_> *batch;
  const_iterator __end1;
  const_iterator __begin1;
  UniValue *in_stack_fffffffffffffee8;
  UniValue *in_stack_fffffffffffffef0;
  UniValue *in_stack_fffffffffffffef8;
  allocator_type *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  UniValue *in_stack_ffffffffffffff18;
  allocator<char> *__a;
  char *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  allocator<char> local_41;
  UniValue *local_40;
  UniValue *local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = UniValue::isArray(in_stack_fffffffffffffee8);
  if (bVar1) {
    sVar5 = UniValue::size(in_stack_fffffffffffffee8);
    std::allocator<UniValue>::allocator((allocator<UniValue> *)in_stack_fffffffffffffee8);
    std::vector<UniValue,_std::allocator<UniValue>_>::vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffff18,
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
    std::allocator<UniValue>::~allocator((allocator<UniValue> *)in_stack_fffffffffffffee8);
    this = (UniValue *)UniValue::getValues(in_stack_ffffffffffffff18);
    local_38 = (UniValue *)
               std::vector<UniValue,_std::allocator<UniValue>_>::begin
                         ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_fffffffffffffef0);
    local_40 = (UniValue *)
               std::vector<UniValue,_std::allocator<UniValue>_>::end
                         ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_fffffffffffffef0);
    while (bVar1 = __gnu_cxx::
                   operator==<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                             ((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                               *)in_stack_fffffffffffffef8,
                              (__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                               *)in_stack_fffffffffffffef0), ((bVar1 ^ 0xffU) & 1) != 0) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                ::operator*((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                             *)in_stack_fffffffffffffee8);
      uVar2 = UniValue::isObject(in_stack_fffffffffffffee8);
      if (!(bool)uVar2) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Batch member must be an object");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_001a2d29;
      }
      __a = &local_41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar2,in_stack_ffffffffffffff38),in_stack_ffffffffffffff30,__a);
      UniValue::operator[](in_stack_fffffffffffffef8,(string *)in_stack_fffffffffffffef0);
      iVar3 = UniValue::getInt<int>(this);
      uVar6 = (ulong)iVar3;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffee8);
      std::allocator<char>::~allocator(&local_41);
      if (sVar5 <= uVar6) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Batch member id is larger than batch size");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_001a2d29;
      }
      std::vector<UniValue,_std::allocator<UniValue>_>::operator[]
                ((vector<UniValue,_std::allocator<UniValue>_> *)this_00,
                 (size_type)in_stack_fffffffffffffef0);
      UniValue::operator=(this_00,in_stack_fffffffffffffef0);
      __gnu_cxx::
      __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
      operator++((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                  *)in_stack_fffffffffffffee8);
      in_stack_fffffffffffffef8 = this_00;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return in_RDI;
    }
  }
  else {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Batch must be an array");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
LAB_001a2d29:
  __stack_chk_fail();
}

Assistant:

std::vector<UniValue> JSONRPCProcessBatchReply(const UniValue& in)
{
    if (!in.isArray()) {
        throw std::runtime_error("Batch must be an array");
    }
    const size_t num {in.size()};
    std::vector<UniValue> batch(num);
    for (const UniValue& rec : in.getValues()) {
        if (!rec.isObject()) {
            throw std::runtime_error("Batch member must be an object");
        }
        size_t id = rec["id"].getInt<int>();
        if (id >= num) {
            throw std::runtime_error("Batch member id is larger than batch size");
        }
        batch[id] = rec;
    }
    return batch;
}